

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

_Bool sk_nextaddr(SockAddr *addr,SockAddrStep *step)

{
  SockAddrStep *step_local;
  SockAddr *addr_local;
  
  if ((step->ai == (addrinfo *)0x0) || (step->ai->ai_next == (addrinfo *)0x0)) {
    addr_local._7_1_ = false;
  }
  else {
    step->ai = step->ai->ai_next;
    addr_local._7_1_ = true;
  }
  return addr_local._7_1_;
}

Assistant:

static bool sk_nextaddr(SockAddr *addr, SockAddrStep *step)
{
#ifndef NO_IPV6
    if (step->ai && step->ai->ai_next) {
        step->ai = step->ai->ai_next;
        return true;
    } else
        return false;
#else
    if (step->curraddr+1 < addr->naddresses) {
        step->curraddr++;
        return true;
    } else {
        return false;
    }
#endif
}